

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aVaryingInterpolationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Accuracy::InterpolationCase::InterpolationCase
          (InterpolationCase *this,Context *context,char *name,char *desc,Precision precision,
          Vec3 *minVal,Vec3 *maxVal,bool projective)

{
  int i;
  long lVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,NODETYPE_ACCURACY,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InterpolationCase_0217f758;
  this->m_precision = precision;
  lVar1 = 0;
  do {
    (this->m_min).m_data[lVar1] = minVal->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    (this->m_max).m_data[lVar1] = maxVal->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  this->m_projective = projective;
  return;
}

Assistant:

InterpolationCase::InterpolationCase (Context& context, const char* name, const char* desc, glu::Precision precision, const tcu::Vec3& minVal, const tcu::Vec3& maxVal, bool projective)
	: TestCase		(context, tcu::NODETYPE_ACCURACY, name, desc)
	, m_precision	(precision)
	, m_min			(minVal)
	, m_max			(maxVal)
	, m_projective	(projective)
{
}